

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::initTest
          (TextureBorderClampSamplerParameterIErrorTest *this)

{
  int iVar1;
  deUint32 dVar2;
  NotSupportedError *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  PnameParams local_f0;
  PnameParams local_dc;
  PnameParams local_c8;
  PnameParams local_b4;
  PnameParams local_a0;
  PnameParams local_8c;
  PnameParams local_78;
  PnameParams local_64;
  PnameParams local_50;
  PnameParams local_3c;
  long local_28;
  Functions *gl;
  TextureBorderClampSamplerParameterIErrorTest *local_10;
  TextureBorderClampSamplerParameterIErrorTest *this_local;
  
  local_10 = this;
  if (((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported &
      1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Texture border clamp functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
               ,0x57);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_28 + 0x6f0))(1,&this->m_sampler_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Error generating sampler object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
                  ,0x5f);
  (**(code **)(local_28 + 0xa8))(0,this->m_sampler_id);
  dVar2 = (**(code **)(local_28 + 0x800))();
  glu::checkError(dVar2,"Error binding sampler object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIError.cpp"
                  ,99);
  PnameParams::PnameParams(&local_3c,0x2800,0x2601,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_3c);
  PnameParams::PnameParams(&local_50,0x2801,0x2702,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_50);
  PnameParams::PnameParams(&local_64,0x813a,1,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_64);
  PnameParams::PnameParams(&local_78,0x813b,1,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_78);
  PnameParams::PnameParams(&local_8c,0x2802,0x2901,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_8c);
  PnameParams::PnameParams(&local_a0,0x2803,0x2901,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_a0);
  PnameParams::PnameParams(&local_b4,0x8072,0x2901,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_b4);
  PnameParams::PnameParams
            (&local_c8,
             (this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
             TEXTURE_BORDER_COLOR,0,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_c8);
  PnameParams::PnameParams(&local_dc,0x884c,0,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_dc);
  PnameParams::PnameParams(&local_f0,0x884d,0x203,0,0,0);
  std::
  vector<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams,_std::allocator<glcts::TextureBorderClampSamplerParameterIErrorTest::PnameParams>_>
  ::push_back(&this->m_pnames_list,&local_f0);
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIErrorTest::initTest(void)
{
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a sampler object */
	gl.genSamplers(1, &m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating sampler object");

	/* Bind the sampler object to a texture unit */
	gl.bindSampler(m_texture_unit_index, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler object");

	/* Fill list with property name + property value pairs that should
	 * be used to verify that glGetSamplerParameterI*() and glSamplerParameterI*()
	 * entry-points generate errors for non-generated sampler objects
	 * as per extension specification.
	 */
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MIN_LOD, 1));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_MAX_LOD, 1));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_S, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_T, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_WRAP_R, GL_REPEAT));
	m_pnames_list.push_back(PnameParams(m_glExtTokens.TEXTURE_BORDER_COLOR, 0, 0, 0, 0));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_COMPARE_MODE, GL_NONE));
	m_pnames_list.push_back(PnameParams(GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL));
}